

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

bool duckdb::ParseBoolean(Value *value,string *loption)

{
  LogicalTypeId LVar1;
  pointer pVVar2;
  pointer pVVar3;
  bool bVar4;
  vector<duckdb::Value,_true> *this;
  const_reference value_00;
  BinderException *pBVar5;
  allocator local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Value local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (value->is_null == true) {
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_a0,"\"%s\" expects a non-null boolean value (e.g. TRUE or 1)",
               (allocator *)&local_c0);
    ::std::__cxx11::string::string((string *)&local_40,(string *)loption);
    BinderException::BinderException<std::__cxx11::string>(pBVar5,(string *)&local_a0,&local_40);
    __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((value->type_).id_ != LIST) {
    LogicalType::LogicalType(&local_a0.type_,FLOAT);
    bVar4 = LogicalType::operator==(&value->type_,&local_a0.type_);
    if (bVar4) {
      LogicalType::~LogicalType(&local_a0.type_);
    }
    else {
      LogicalType::LogicalType((LogicalType *)&local_c0,DOUBLE);
      bVar4 = LogicalType::operator==(&value->type_,(LogicalType *)&local_c0);
      LVar1 = (value->type_).id_;
      LogicalType::~LogicalType((LogicalType *)&local_c0);
      LogicalType::~LogicalType(&local_a0.type_);
      if (!bVar4 && LVar1 != DECIMAL) {
        LogicalType::LogicalType((LogicalType *)&local_c0,BOOLEAN);
        Value::DefaultCastAs(&local_a0,value,(LogicalType *)&local_c0,false);
        bVar4 = BooleanValue::Get(&local_a0);
        Value::~Value(&local_a0);
        LogicalType::~LogicalType((LogicalType *)&local_c0);
        return bVar4;
      }
    }
    pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_a0,"\"%s\" expects a boolean value (e.g. TRUE or 1)",
               (allocator *)&local_c0);
    ::std::__cxx11::string::string((string *)&local_60,(string *)loption);
    BinderException::BinderException<std::__cxx11::string>(pBVar5,(string *)&local_a0,&local_60);
    __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this = ListValue::GetChildren(value);
  pVVar2 = (this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar2 == pVVar3) {
    bVar4 = true;
  }
  else {
    if (0x40 < (ulong)((long)pVVar3 - (long)pVVar2)) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_a0,
                 "\"%s\" expects a single argument as a boolean value (e.g. TRUE or 1)",&local_c1);
      ::std::__cxx11::string::string((string *)&local_c0,(string *)loption);
      BinderException::BinderException<std::__cxx11::string>(pBVar5,(string *)&local_a0,&local_c0);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    value_00 = vector<duckdb::Value,_true>::get<true>(this,0);
    bVar4 = ParseBoolean(value_00,loption);
  }
  return bVar4;
}

Assistant:

static bool ParseBoolean(const Value &value, const string &loption) {
	if (value.IsNull()) {
		throw BinderException("\"%s\" expects a non-null boolean value (e.g. TRUE or 1)", loption);
	}
	if (value.type().id() == LogicalTypeId::LIST) {
		auto &children = ListValue::GetChildren(value);
		return ParseBoolean(children, loption);
	}
	if (value.type() == LogicalType::FLOAT || value.type() == LogicalType::DOUBLE ||
	    value.type().id() == LogicalTypeId::DECIMAL) {
		throw BinderException("\"%s\" expects a boolean value (e.g. TRUE or 1)", loption);
	}
	return BooleanValue::Get(value.DefaultCastAs(LogicalType::BOOLEAN));
}